

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O2

size_t asmjit::v1_14::Support::bitVectorIndexOf<unsigned_long>
                 (unsigned_long *buf,size_t start,bool value)

{
  long lVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  puVar2 = buf + (start >> 6);
  uVar3 = start & 0xffffffffffffffc0;
  uVar4 = (*puVar2 >> ((byte)start & 0x3f)) << ((byte)start & 0x3f);
  while (puVar2 = puVar2 + 1, uVar4 == 0) {
    uVar3 = uVar3 + 0x40;
    uVar4 = *puVar2;
  }
  lVar1 = 0;
  if (uVar4 != 0) {
    for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  return lVar1 + uVar3;
}

Assistant:

static ASMJIT_FORCE_INLINE size_t bitVectorIndexOf(T* buf, size_t start, bool value) noexcept {
  const size_t kTSizeInBits = bitSizeOf<T>();
  size_t vecIndex = start / kTSizeInBits; // T[]
  size_t bitIndex = start % kTSizeInBits; // T[][]

  T* p = buf + vecIndex;

  // We always look for zeros, if value is `true` we have to flip all bits before the search.
  const T kFillMask = allOnes<T>();
  const T kFlipMask = value ? T(0) : kFillMask;

  // The first BitWord requires special handling as there are some bits we want to ignore.
  T bits = (*p ^ kFlipMask) & (kFillMask << bitIndex);
  for (;;) {
    if (bits)
      return (size_t)(p - buf) * kTSizeInBits + ctz(bits);
    bits = *++p ^ kFlipMask;
  }
}